

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

StatementSyntax * __thiscall
slang::parsing::Parser::parseRandSequenceStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL> elements_00;
  Token randsequence;
  Token openParen_00;
  Token firstProduction;
  Token closeParen_00;
  Token endsequence_00;
  undefined8 attributes_00;
  Info *productions_00;
  undefined1 uVar1;
  bool bVar2;
  SyntaxNode *pSVar3;
  reference ppPVar4;
  SyntaxFactory *this_00;
  RandSequenceStatementSyntax *pRVar5;
  Info *pIVar7;
  EVP_PKEY_CTX *src;
  Info *in_RSI;
  undefined8 *in_RDI;
  Token TVar8;
  Token TVar9;
  Token endsequence;
  Token curr;
  SmallVector<slang::syntax::ProductionSyntax_*,_5UL> productions;
  Token closeParen;
  Token firstProd;
  Token openParen;
  Token keyword;
  ParserBase *in_stack_fffffffffffffcf8;
  ParserBase *in_stack_fffffffffffffd00;
  pointer in_stack_fffffffffffffd08;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd10;
  ParserBase *in_stack_fffffffffffffd20;
  Info *in_stack_fffffffffffffd38;
  undefined8 *puVar10;
  ParserBase *in_stack_fffffffffffffd60;
  SourceLocation in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  DiagCode in_stack_fffffffffffffd74;
  Info *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  undefined8 uVar11;
  undefined6 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  ParserBase *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffdc8;
  Token local_120;
  SourceLocation local_110;
  undefined4 local_104;
  _Storage<slang::DiagCode,_true> local_100;
  undefined2 local_fc;
  _Storage<slang::DiagCode,_true> local_f6;
  undefined2 local_f2;
  Token local_f0;
  undefined8 local_e0;
  ProductionSyntax *local_d8;
  Token local_d0;
  Parser *in_stack_ffffffffffffff40;
  TokenKind local_b0;
  SmallVectorBase<slang::syntax::ProductionSyntax_*> local_a0 [2];
  Token local_60;
  Token local_50;
  Token local_40;
  Token local_30;
  Info *local_20;
  Info *pIVar6;
  
  local_20 = in_RSI;
  local_30 = ParserBase::consume(in_stack_fffffffffffffd20);
  local_40 = ParserBase::expect(in_stack_fffffffffffffd90,
                                CONCAT11(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd8e));
  local_50 = ParserBase::consumeIf
                       (in_stack_fffffffffffffd00,
                        (TokenKind)((ulong)in_stack_fffffffffffffcf8 >> 0x30));
  local_60 = ParserBase::expect(in_stack_fffffffffffffd90,
                                CONCAT11(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd8e));
  SmallVector<slang::syntax::ProductionSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::ProductionSyntax_*,_5UL> *)0x8d94bf);
  while( true ) {
    TVar8 = ParserBase::peek(in_stack_fffffffffffffcf8);
    pIVar6 = TVar8.info;
    local_b0 = TVar8.kind;
    uVar1 = slang::syntax::SyntaxFacts::isPossibleDataType(local_b0);
    if (!(bool)uVar1) break;
    TVar8 = ParserBase::peek(in_stack_fffffffffffffcf8);
    local_d0 = TVar8;
    local_d8 = parseProduction(in_stack_ffffffffffffff40);
    SmallVectorBase<slang::syntax::ProductionSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::ProductionSyntax_*> *)in_stack_fffffffffffffd00,
               (ProductionSyntax **)in_stack_fffffffffffffcf8);
    local_e0 = 0;
    pSVar3 = std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                       ((SyntaxNode **)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->alloc);
    ppPVar4 = SmallVectorBase<slang::syntax::ProductionSyntax_*>::back(local_a0);
    ((*ppPVar4)->super_SyntaxNode).previewNode = pSVar3;
    TVar8 = ParserBase::peek(in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd90 = (ParserBase *)TVar8.info;
    local_f0 = TVar8;
    in_stack_fffffffffffffd8f = Token::operator==(&local_d0,&local_f0);
    if ((bool)in_stack_fffffffffffffd8f) {
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_f6);
      local_fc = local_f2;
      local_100 = local_f6;
      ParserBase::skipToken
                ((ParserBase *)CONCAT17(uVar1,in_stack_fffffffffffffdc8),
                 (_Optional_base<slang::DiagCode,_true,_true>)SUB86((ulong)pIVar6 >> 0x10,0));
    }
  }
  bVar2 = SmallVectorBase<slang::syntax::ProductionSyntax_*>::empty(local_a0);
  TVar8.info = in_stack_fffffffffffffd78;
  TVar8.kind = (short)in_stack_fffffffffffffd80;
  TVar8._2_1_ = (char)((ulong)in_stack_fffffffffffffd80 >> 0x10);
  TVar8.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd80 >> 0x18);
  TVar8.rawLen = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  if (bVar2) {
    local_104 = 0x4f0005;
    TVar8 = ParserBase::peek(in_stack_fffffffffffffcf8);
    local_120 = TVar8;
    local_110 = Token::location(&local_120);
    in_stack_fffffffffffffd70 = local_110._0_4_;
    in_stack_fffffffffffffd74 = local_110._4_4_;
    ParserBase::addDiag(in_stack_fffffffffffffd60,in_stack_fffffffffffffd74,
                        in_stack_fffffffffffffd68);
  }
  TVar9 = ParserBase::expect(in_stack_fffffffffffffd90,
                             CONCAT11(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd8e));
  pIVar7 = TVar9.info;
  this_00 = TVar9._0_8_;
  puVar10 = in_RDI + 0x1c;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffd10._M_extent_value;
  elements._M_ptr = (pointer)in_stack_fffffffffffffd08;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd00,
             elements);
  productions_00 = local_50.info;
  attributes_00 = local_60._0_8_;
  pIVar6 = local_60.info;
  SmallVectorBase<slang::syntax::ProductionSyntax_*>::copy(local_a0,(EVP_PKEY_CTX *)*in_RDI,src);
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffd10._M_extent_value;
  elements_00._M_ptr = in_stack_fffffffffffffd08;
  slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ProductionSyntax> *)in_stack_fffffffffffffd00,elements_00);
  uVar11 = TVar8._0_8_;
  randsequence.info = in_stack_fffffffffffffd38;
  randsequence._0_8_ = pIVar7;
  openParen_00.info = local_20;
  openParen_00._0_8_ = puVar10;
  firstProduction.info = TVar9._0_8_;
  firstProduction._0_8_ = TVar9.info;
  closeParen_00.rawLen._0_2_ = in_stack_fffffffffffffd74.subsystem;
  closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffd74.code;
  closeParen_00.kind = (short)in_stack_fffffffffffffd70;
  closeParen_00._2_1_ = (char)((uint)in_stack_fffffffffffffd70 >> 0x10);
  closeParen_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffd70 >> 0x18);
  closeParen_00.info = TVar8.info;
  endsequence_00.info._0_6_ = in_stack_fffffffffffffd88;
  endsequence_00.kind = (short)uVar11;
  endsequence_00._2_1_ = (char)((ulong)uVar11 >> 0x10);
  endsequence_00.numFlags.raw = (char)((ulong)uVar11 >> 0x18);
  endsequence_00.rawLen = (int)((ulong)uVar11 >> 0x20);
  endsequence_00.info._6_1_ = in_stack_fffffffffffffd8e;
  endsequence_00.info._7_1_ = in_stack_fffffffffffffd8f;
  pRVar5 = slang::syntax::SyntaxFactory::randSequenceStatement
                     (this_00,(NamedLabelSyntax *)pIVar6,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes_00,
                      randsequence,openParen_00,firstProduction,closeParen_00,
                      (SyntaxList<slang::syntax::ProductionSyntax> *)productions_00,endsequence_00);
  SmallVector<slang::syntax::ProductionSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::ProductionSyntax_*,_5UL> *)0x8d9933);
  return &pRVar5->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseRandSequenceStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto firstProd = consumeIf(TokenKind::Identifier);
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<ProductionSyntax*> productions;
    while (isPossibleDataType(peek().kind)) {
        auto curr = peek();
        productions.push_back(&parseProduction());
        productions.back()->previewNode = std::exchange(previewNode, nullptr);

        // If there are no consumed tokens then production was not parsed.
        if (curr == peek())
            skipToken(std::nullopt);
    }

    if (productions.empty())
        addDiag(diag::ExpectedRsRule, peek().location());

    auto endsequence = expect(TokenKind::EndSequenceKeyword);
    return factory.randSequenceStatement(label, attributes, keyword, openParen, firstProd,
                                         closeParen, productions.copy(alloc), endsequence);
}